

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
          (ExtensionSet *this,int start_field_number,int end_field_number,bool deterministic,
          uint8 *target)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var3->_M_header;
  for (; p_Var1 != (_Rb_tree_node_base *)0x0;
      p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < start_field_number]) {
    if (start_field_number <= (int)p_Var1[1]._M_color) {
      p_Var2 = p_Var1;
    }
  }
  for (; ((_Rb_tree_header *)p_Var2 != p_Var3 && ((int)p_Var2[1]._M_color < end_field_number));
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    target = Extension::InternalSerializeFieldWithCachedSizesToArray
                       ((Extension *)&p_Var2[1]._M_parent,p_Var2[1]._M_color,deterministic,target);
  }
  return target;
}

Assistant:

uint8* ExtensionSet::InternalSerializeWithCachedSizesToArray(
    int start_field_number, int end_field_number,
    bool deterministic, uint8* target) const {
  ExtensionMap::const_iterator iter;
  for (iter = extensions_.lower_bound(start_field_number);
       iter != extensions_.end() && iter->first < end_field_number;
       ++iter) {
    target = iter->second.InternalSerializeFieldWithCachedSizesToArray(
        iter->first, deterministic, target);
  }
  return target;
}